

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pointer __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
::iterator::operator->(iterator *this)

{
  reference ppVar1;
  
  AssertIsFull(this->ctrl_,'\0',(GenerationType *)0x0,"operator->");
  ppVar1 = operator*(this);
  return ppVar1;
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }